

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ed.c
# Opt level: O0

void ed_double(ed *out,ed *P)

{
  limb_t *in_RSI;
  fld_t h;
  fld_t g;
  fld_t f;
  fld_t e;
  fld_t d;
  fld_t c;
  fld_t b;
  fld_t a;
  limb_t alStackY_188 [6];
  limb_t local_158 [6];
  limb_t local_128 [4];
  limb_t *in_stack_fffffffffffffef8;
  limb_t *in_stack_ffffffffffffff00;
  limb_t local_f8 [6];
  limb_t local_c8 [6];
  limb_t local_98;
  limb_t *in_stack_ffffffffffffff70;
  limb_t *in_stack_ffffffffffffff78;
  limb_t *in_stack_ffffffffffffff80;
  limb_t local_68 [6];
  limb_t local_38 [5];
  limb_t *local_10;
  
  local_10 = in_RSI;
  fld_sub(local_38,in_RSI + 5,in_RSI);
  fld_sq(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fld_add(local_68,local_10 + 5,local_10);
  fld_sq(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fld_sq(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fld_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fld_sq(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  fld_scale2(local_c8,local_c8);
  fld_sub(local_f8,local_68,local_38);
  fld_sub(local_128,local_c8,&local_98);
  fld_add(local_158,local_c8,&local_98);
  fld_add(alStackY_188,local_68,local_38);
  fld_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fld_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fld_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  fld_mul(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  return;
}

Assistant:

static void
ed_double(struct ed *out, const struct ed *P)
{
	fld_t a, b, c, d, e, f, g, h;
	
	fld_sub(a, P->y, P->x);
	fld_sq(a, a);

	fld_add(b, P->y, P->x);
	fld_sq(b, b);

	fld_sq(c, P->t);
	fld_mul(c, c, con_2d);

	fld_sq(d, P->z);
	fld_scale2(d, d);

	fld_sub(e, b, a);
	fld_sub(f, d, c);
	fld_add(g, d, c);
	fld_add(h, b, a);
	
	fld_mul(out->x, e, f);
	fld_mul(out->y, g, h);
	fld_mul(out->t, e, h);
	fld_mul(out->z, f, g);
}